

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ExprList *pEVar1;
  SrcList *pSVar2;
  Expr *p;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Bitmask BVar6;
  ulong uVar7;
  ExprList_item *pEVar8;
  long lVar9;
  long lVar10;
  Bitmask BVar11;
  
  if (pS == (Select *)0x0) {
    BVar11 = 0;
  }
  else {
    BVar11 = 0;
    do {
      pEVar1 = pS->pEList;
      pSVar2 = pS->pSrc;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar7 = 0;
      }
      else {
        pEVar8 = pEVar1->a;
        lVar10 = 0;
        uVar7 = 0;
        do {
          if (pEVar8->pExpr == (Expr *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
          }
          uVar7 = uVar7 | uVar3;
          lVar10 = lVar10 + 1;
          pEVar8 = pEVar8 + 1;
        } while (lVar10 < pEVar1->nExpr);
      }
      pEVar1 = pS->pGroupBy;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar3 = 0;
      }
      else {
        pEVar8 = pEVar1->a;
        lVar10 = 0;
        uVar3 = 0;
        do {
          if (pEVar8->pExpr == (Expr *)0x0) {
            uVar4 = 0;
          }
          else {
            uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
          }
          uVar3 = uVar3 | uVar4;
          lVar10 = lVar10 + 1;
          pEVar8 = pEVar8 + 1;
        } while (lVar10 < pEVar1->nExpr);
      }
      pEVar1 = pS->pOrderBy;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar4 = 0;
      }
      else {
        pEVar8 = pEVar1->a;
        lVar10 = 0;
        uVar4 = 0;
        do {
          if (pEVar8->pExpr == (Expr *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
          }
          uVar4 = uVar4 | uVar5;
          lVar10 = lVar10 + 1;
          pEVar8 = pEVar8 + 1;
        } while (lVar10 < pEVar1->nExpr);
      }
      if (pS->pWhere == (Expr *)0x0) {
        BVar6 = 0;
      }
      else {
        BVar6 = sqlite3WhereExprUsageNN(pMaskSet,pS->pWhere);
      }
      if (pS->pHaving == (Expr *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pS->pHaving);
      }
      BVar11 = uVar7 | BVar11 | uVar3 | uVar4 | BVar6 | uVar5;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        lVar10 = 0;
        do {
          if ((pSVar2->a[lVar10].fg.field_0x1 & 4) != 0) {
            BVar6 = exprSelectUsage(pMaskSet,(pSVar2->a[lVar10].u4.pSubq)->pSelect);
            BVar11 = BVar11 | BVar6;
          }
          if ((pSVar2->a[lVar10].fg.field_0x2 & 8) == 0) {
            p = pSVar2->a[lVar10].u3.pOn;
            if (p == (Expr *)0x0) {
              uVar7 = 0;
            }
            else {
              uVar7 = sqlite3WhereExprUsageNN(pMaskSet,p);
            }
            BVar11 = BVar11 | uVar7;
          }
          if ((pSVar2->a[lVar10].fg.field_0x1 & 8) != 0) {
            pEVar1 = pSVar2->a[lVar10].u1.pFuncArg;
            if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
              uVar7 = 0;
            }
            else {
              pEVar8 = pEVar1->a;
              lVar9 = 0;
              uVar7 = 0;
              do {
                if (pEVar8->pExpr == (Expr *)0x0) {
                  uVar3 = 0;
                }
                else {
                  uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
                }
                uVar7 = uVar7 | uVar3;
                lVar9 = lVar9 + 1;
                pEVar8 = pEVar8 + 1;
              } while (lVar9 < pEVar1->nExpr);
            }
            BVar11 = BVar11 | uVar7;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pSVar2->nSrc);
      }
      pS = pS->pPrior;
    } while (pS != (Select *)0x0);
  }
  return BVar11;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        if( pSrc->a[i].fg.isSubquery ){
          mask |= exprSelectUsage(pMaskSet, pSrc->a[i].u4.pSubq->pSelect);
        }
        if( pSrc->a[i].fg.isUsing==0 ){
          mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].u3.pOn);
        }
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}